

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ElemStack.cpp
# Opt level: O1

void __thiscall xercesc_4_0::ElemStack::addPrefix(ElemStack *this,XMLCh *prefixToAdd,uint uriId)

{
  RefHashTableOf<xercesc_4_0::XMLStringPool::PoolElem,_xercesc_4_0::StringHasher> *pRVar1;
  StackElem *toExpand;
  PrefMapElem *pPVar2;
  XMLSize_t XVar3;
  bool bVar4;
  uint uVar5;
  ulong uVar6;
  PoolElem *pPVar7;
  EmptyStackException *this_00;
  RefHashTableBucketElem<xercesc_4_0::XMLStringPool::PoolElem> *pRVar8;
  XMLCh *pXVar9;
  XMLCh XVar10;
  
  if (this->fStackTop == 0) {
    this_00 = (EmptyStackException *)__cxa_allocate_exception(0x30);
    EmptyStackException::EmptyStackException
              (this_00,
               "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/internal/ElemStack.cpp"
               ,0x13a,ElemStack_EmptyStack,this->fMemoryManager);
    __cxa_throw(this_00,&EmptyStackException::typeinfo,XMLException::~XMLException);
  }
  pRVar1 = (this->fPrefixPool).fHashTable;
  toExpand = this->fStack[this->fStackTop - 1];
  if ((prefixToAdd == (XMLCh *)0x0) || (uVar6 = (ulong)(ushort)*prefixToAdd, uVar6 == 0)) {
    uVar6 = 0;
  }
  else {
    XVar10 = prefixToAdd[1];
    if (XVar10 != L'\0') {
      pXVar9 = prefixToAdd + 2;
      do {
        uVar6 = (ulong)(ushort)XVar10 + (uVar6 >> 0x18) + uVar6 * 0x26;
        XVar10 = *pXVar9;
        pXVar9 = pXVar9 + 1;
      } while (XVar10 != L'\0');
    }
    uVar6 = uVar6 % pRVar1->fHashModulus;
  }
  pRVar8 = pRVar1->fBucketList[uVar6];
  if (pRVar8 != (RefHashTableBucketElem<xercesc_4_0::XMLStringPool::PoolElem> *)0x0) {
    do {
      bVar4 = StringHasher::equals((StringHasher *)&pRVar1->field_0x30,prefixToAdd,pRVar8->fKey);
      if (bVar4) goto LAB_002a47fd;
      pRVar8 = pRVar8->fNext;
    } while (pRVar8 != (RefHashTableBucketElem<xercesc_4_0::XMLStringPool::PoolElem> *)0x0);
  }
  pRVar8 = (RefHashTableBucketElem<xercesc_4_0::XMLStringPool::PoolElem> *)0x0;
LAB_002a47fd:
  if (pRVar8 == (RefHashTableBucketElem<xercesc_4_0::XMLStringPool::PoolElem> *)0x0) {
    pPVar7 = (PoolElem *)0x0;
  }
  else {
    pPVar7 = pRVar8->fData;
  }
  if (pPVar7 == (PoolElem *)0x0) {
    uVar5 = XMLStringPool::addNewEntry(&this->fPrefixPool,prefixToAdd);
  }
  else {
    uVar5 = pPVar7->fId;
  }
  if (toExpand->fMapCount == toExpand->fMapCapacity) {
    expandMap(this,toExpand);
  }
  pPVar2 = toExpand->fMap;
  XVar3 = toExpand->fMapCount;
  pPVar2[XVar3].fPrefId = uVar5;
  pPVar2[XVar3].fURIId = uriId;
  toExpand->fMapCount = XVar3 + 1;
  return;
}

Assistant:

void ElemStack::addPrefix(  const   XMLCh* const    prefixToAdd
                            , const unsigned int    uriId)
{
    if (!fStackTop)
        ThrowXMLwithMemMgr(EmptyStackException, XMLExcepts::ElemStack_EmptyStack, fMemoryManager);

    // Get a convenience pointer to the stack top row
    StackElem* curRow = fStack[fStackTop - 1];

    // Map the prefix to its unique id
    const unsigned int prefId = fPrefixPool.addOrFind(prefixToAdd);

    //
    //  Add a new element to the prefix map for this element. If its full,
    //  then expand it out.
    //
    if (curRow->fMapCount == curRow->fMapCapacity)
        expandMap(curRow);

    //
    //  And now add a new element for this prefix. Watch for the special case
    //  of xmlns=="", and force it to ""=[globalid]
    //
    curRow->fMap[curRow->fMapCount].fPrefId = prefId;
    if ((prefId == fGlobalPoolId) && (uriId == fEmptyNamespaceId))
        curRow->fMap[curRow->fMapCount].fURIId = fEmptyNamespaceId;
    else
        curRow->fMap[curRow->fMapCount].fURIId = uriId;

    // Bump the map count now
    curRow->fMapCount++;
}